

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

int32_t GetTransactionWeight(CTransaction *tx)

{
  size_t sVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_38;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_params = &TX_NO_WITNESS;
  local_28.m_object = tx;
  sVar1 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>(&local_28);
  local_38.m_params = &TX_WITH_WITNESS;
  local_38.m_object = tx;
  sVar2 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)sVar2 + (int)sVar1 * 3;
  }
  __stack_chk_fail();
}

Assistant:

static inline int32_t GetTransactionWeight(const CTransaction& tx)
{
    return ::GetSerializeSize(TX_NO_WITNESS(tx)) * (WITNESS_SCALE_FACTOR - 1) + ::GetSerializeSize(TX_WITH_WITNESS(tx));
}